

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleUVRowDown2_C(uint8_t *src_uv,ptrdiff_t src_stride,uint8_t *dst_uv,int dst_width)

{
  long lVar1;
  uint16_t *dst;
  uint16_t *src;
  
  for (lVar1 = 0; (int)lVar1 < dst_width + -1; lVar1 = lVar1 + 2) {
    *(undefined2 *)(dst_uv + lVar1 * 2) = *(undefined2 *)(src_uv + lVar1 * 2 + 2);
    *(undefined2 *)(dst_uv + lVar1 * 2 + 2) = *(undefined2 *)(src_uv + lVar1 * 2 + 6);
  }
  if ((dst_width & 1U) != 0) {
    *(undefined2 *)(dst_uv + lVar1 * 2) = *(undefined2 *)(src_uv + lVar1 * 2 + 2);
  }
  return;
}

Assistant:

void ScaleUVRowDown2_C(const uint8_t* src_uv,
                       ptrdiff_t src_stride,
                       uint8_t* dst_uv,
                       int dst_width) {
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  int x;
  (void)src_stride;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = src[1];
    dst[1] = src[3];
    src += 2;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[1];
  }
}